

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletload_tests.cpp
# Opt level: O2

void __thiscall wallet::walletload_tests::DummyDescriptor::~DummyDescriptor(DummyDescriptor *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::~string((string *)&this->desc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(this,0x28);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~DummyDescriptor() = default;